

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void aom_flat_block_finder_extract_block
               (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,int offsx
               ,int offsy,double *plane,double *block)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_1;
  int y_1;
  int x;
  int y;
  uint16_t *data16;
  int i;
  int yi;
  int xi;
  double AtA_inv_b [3];
  double plane_coords [3];
  double *AtA_inv;
  double *A;
  int n;
  int block_size;
  int local_84;
  int local_80;
  int local_7c;
  double local_78 [4];
  double local_58 [4];
  double *local_38;
  double *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  undefined8 *local_8;
  
  local_24 = *(int *)((long)in_RDI + 0x14);
  local_28 = local_24 * local_24;
  local_30 = (double *)in_RDI[1];
  local_38 = (double *)*in_RDI;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  if (*(int *)(in_RDI + 4) == 0) {
    local_10 = in_RSI;
    for (local_80 = 0; local_80 < local_24; local_80 = local_80 + 1) {
      iVar1 = clamp(x_1 + local_80,0,local_18 + -1);
      for (local_7c = 0; local_7c < local_24; local_7c = local_7c + 1) {
        iVar2 = clamp(local_20 + local_7c,0,local_14 + -1);
        *(double *)(data16 + (long)(local_80 * local_24 + local_7c) * 4) =
             (double)*(byte *)(local_10 + (iVar1 * local_1c + iVar2)) / (double)local_8[3];
      }
    }
  }
  else {
    for (local_80 = 0; local_80 < local_24; local_80 = local_80 + 1) {
      iVar1 = clamp(x_1 + local_80,0,local_18 + -1);
      for (local_7c = 0; local_7c < local_24; local_7c = local_7c + 1) {
        iVar2 = clamp(local_20 + local_7c,0,local_14 + -1);
        *(double *)(data16 + (long)(local_80 * local_24 + local_7c) * 4) =
             (double)*(ushort *)(in_RSI + (long)(iVar1 * local_1c + iVar2) * 2) / (double)local_8[3]
        ;
      }
    }
  }
  multiply_mat((double *)data16,local_30,local_78,1,local_28,3);
  multiply_mat(local_38,local_78,local_58,3,3,1);
  multiply_mat(local_30,local_58,_x,local_28,3,1);
  for (local_84 = 0; local_84 < local_28; local_84 = local_84 + 1) {
    *(double *)(data16 + (long)local_84 * 4) =
         *(double *)(data16 + (long)local_84 * 4) - _x[local_84];
  }
  return;
}

Assistant:

void aom_flat_block_finder_extract_block(
    const aom_flat_block_finder_t *block_finder, const uint8_t *const data,
    int w, int h, int stride, int offsx, int offsy, double *plane,
    double *block) {
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double *A = block_finder->A;
  const double *AtA_inv = block_finder->AtA_inv;
  double plane_coords[kLowPolyNumParams];
  double AtA_inv_b[kLowPolyNumParams];
  int xi, yi, i;

  if (block_finder->use_highbd) {
    const uint16_t *const data16 = (const uint16_t *const)data;
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data16[y * stride + x]) / block_finder->normalization;
      }
    }
  } else {
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data[y * stride + x]) / block_finder->normalization;
      }
    }
  }
  multiply_mat(block, A, AtA_inv_b, 1, n, kLowPolyNumParams);
  multiply_mat(AtA_inv, AtA_inv_b, plane_coords, kLowPolyNumParams,
               kLowPolyNumParams, 1);
  multiply_mat(A, plane_coords, plane, n, kLowPolyNumParams, 1);

  for (i = 0; i < n; ++i) {
    block[i] -= plane[i];
  }
}